

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  size_t this_00;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  uint uVar4;
  cmExportSet *pcVar5;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *pvVar6;
  ostream *poVar7;
  string *psVar8;
  reference ppcVar9;
  char *pcVar10;
  reference pbVar11;
  pair<std::_Rb_tree_const_iterator<cmGeneratorTarget_*>,_bool> pVar12;
  bool local_515;
  bool local_4d9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_460;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_458;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_450;
  const_iterator ci;
  undefined1 local_440 [6];
  bool result;
  allocator local_419;
  string local_418;
  bool local_3f2;
  allocator local_3f1;
  undefined1 local_3f0 [6];
  bool newCMP0022Behavior;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350;
  undefined1 local_330 [8];
  ImportPropertyMap properties;
  cmGeneratorTarget *gt;
  __normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_2f0;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_2e8;
  const_iterator tei_1;
  undefined1 local_2d8 [4];
  bool requiresConfigFiles;
  bool require3_1_0;
  bool require3_0_0;
  bool require2_8_12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  string local_2b8 [32];
  undefined1 local_298 [8];
  ostringstream e;
  cmTargetExport *local_100;
  cmTargetExport *te;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_98 [3];
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_80;
  const_iterator tei;
  string sep;
  string expectedTargets;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostream *os_local;
  cmExportInstallFileGenerator *this_local;
  
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::vector
            ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
             ((long)&expectedTargets.field_2 + 8));
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&tei);
  pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
  pvVar6 = cmExportSet::GetTargetExports(pcVar5);
  local_80._M_current =
       (cmTargetExport **)
       std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(pvVar6);
  do {
    pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
    pvVar6 = cmExportSet::GetTargetExports(pcVar5);
    local_98[0]._M_current =
         (cmTargetExport **)
         std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(pvVar6);
    bVar1 = __gnu_cxx::operator!=(&local_80,local_98);
    if (!bVar1) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])
                (this,os,(undefined1 *)((long)&sep.field_2 + 8));
      missingTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_0084aee3:
      std::__cxx11::string::~string((string *)&tei);
      std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
      if (missingTargets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x13])(this,os);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2d8);
        tei_1._M_current._7_1_ = 0;
        tei_1._M_current._6_1_ = 0;
        tei_1._M_current._5_1_ = 0;
        tei_1._M_current._4_1_ = 0;
        local_2f0._M_current =
             (cmTargetExport **)
             std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin
                       ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                        ((long)&expectedTargets.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<cmTargetExport*const*,std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>>
        ::__normal_iterator<cmTargetExport**>
                  ((__normal_iterator<cmTargetExport*const*,std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>>
                    *)&local_2e8,&local_2f0);
        while( true ) {
          gt = (cmGeneratorTarget *)
               std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end
                         ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                          ((long)&expectedTargets.field_2 + 8));
          bVar1 = __gnu_cxx::operator!=
                            (&local_2e8,
                             (__normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                              *)&gt);
          if (!bVar1) break;
          ppcVar9 = __gnu_cxx::
                    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                    ::operator*(&local_2e8);
          properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)(*ppcVar9)->Target;
          local_4d9 = true;
          if ((tei_1._M_current._4_1_ & 1) == 0) {
            TVar2 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)
                               properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_4d9 = TVar2 != INTERFACE_LIBRARY;
          }
          tei_1._M_current._4_1_ = local_4d9;
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                    (this,os,properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_330);
          ppcVar9 = __gnu_cxx::
                    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                    ::operator*(&local_2e8);
          cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                    (&this->super_cmExportFileGenerator,*ppcVar9,InstallInterface,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_330,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8);
          ppcVar9 = __gnu_cxx::
                    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                    ::operator*(&local_2e8);
          cmExportFileGenerator::PopulateSourcesInterface
                    (&this->super_cmExportFileGenerator,*ppcVar9,InstallInterface,
                     (ImportPropertyMap *)local_330,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_350,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_351);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_350,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_330,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8);
          std::__cxx11::string::~string((string *)&local_350);
          std::allocator<char>::~allocator((allocator<char> *)&local_351);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_378,"INTERFACE_COMPILE_DEFINITIONS",&local_379);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_378,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_330,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8);
          std::__cxx11::string::~string((string *)&local_378);
          std::allocator<char>::~allocator((allocator<char> *)&local_379);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3a0,"INTERFACE_COMPILE_OPTIONS",&local_3a1);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_3a0,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_330,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3c8,"INTERFACE_AUTOUIC_OPTIONS",&local_3c9);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_3c8,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_330,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_3f0,"INTERFACE_COMPILE_FEATURES",&local_3f1);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,(string *)local_3f0,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_330,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8);
          std::__cxx11::string::~string((string *)local_3f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
          PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022
                            ((cmGeneratorTarget *)
                             properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          local_515 = false;
          if (PVar3 != WARN) {
            PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022
                              ((cmGeneratorTarget *)
                               properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_515 = PVar3 != OLD;
          }
          local_3f2 = local_515;
          if (((local_515 != false) &&
              (bVar1 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                                 (&this->super_cmExportFileGenerator,
                                  (cmGeneratorTarget *)
                                  properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  InstallInterface,(ImportPropertyMap *)local_330,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_2d8), bVar1)) &&
             (((this->super_cmExportFileGenerator).ExportOld & 1U) == 0)) {
            tei_1._M_current._7_1_ = 1;
          }
          TVar2 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)
                             properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          this_00 = properties._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if (TVar2 == INTERFACE_LIBRARY) {
            tei_1._M_current._6_1_ = 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_418,"INTERFACE_SOURCES",&local_419);
          pcVar10 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)this_00,&local_418);
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator((allocator<char> *)&local_419);
          if (pcVar10 != (char *)0x0) {
            tei_1._M_current._5_1_ = 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_440,"INTERFACE_POSITION_INDEPENDENT_CODE",
                     (allocator *)((long)&ci._M_current + 7));
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,(string *)local_440,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (ImportPropertyMap *)local_330);
          std::__cxx11::string::~string((string *)local_440);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ci._M_current + 7));
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (ImportPropertyMap *)local_330);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,properties._M_t._M_impl.super__Rb_tree_header._M_node_count,os,local_330);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_330);
          __gnu_cxx::
          __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
          ::operator++(&local_2e8);
        }
        if ((tei_1._M_current._5_1_ & 1) == 0) {
          if ((tei_1._M_current._6_1_ & 1) == 0) {
            if ((tei_1._M_current._7_1_ & 1) != 0) {
              (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                        (this,os,"2.8.12");
            }
          }
          else {
            (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                      (this,os,"3.0.0");
          }
        }
        else {
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,"3.1.0");
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x14])(this,os);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(this,os);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,os);
        ci._M_current._6_1_ = 1;
        if ((tei_1._M_current._4_1_ & 1) != 0) {
          local_458._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&(this->super_cmExportFileGenerator).Configurations);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_450,&local_458);
          while( true ) {
            local_460._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&(this->super_cmExportFileGenerator).Configurations);
            bVar1 = __gnu_cxx::operator!=(&local_450,&local_460);
            if (!bVar1) break;
            pbVar11 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_450);
            uVar4 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])
                              (this,pbVar11,local_2d8);
            if ((uVar4 & 1) == 0) {
              ci._M_current._6_1_ = 0;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_450);
          }
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os,local_2d8);
        this_local._7_1_ = ci._M_current._6_1_ & 1;
        missingTargets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8);
      }
      std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~vector
                ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                 ((long)&expectedTargets.field_2 + 8));
      return (bool)(this_local._7_1_ & 1);
    }
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tei,
                   &(this->super_cmExportFileGenerator).Namespace);
    ppcVar9 = __gnu_cxx::
              __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
              ::operator*(&local_80);
    cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&te,(*ppcVar9)->Target);
    std::operator+(&local_b8,&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&te);
    std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&te);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::operator=((string *)&tei," ");
    ppcVar9 = __gnu_cxx::
              __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
              ::operator*(&local_80);
    local_100 = *ppcVar9;
    pVar12 = std::
             set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
             ::insert(&(this->super_cmExportFileGenerator).ExportedTargets,&local_100->Target);
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      poVar7 = std::operator<<((ostream *)local_298,"install(EXPORT \"");
      pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
      psVar8 = cmExportSet::GetName_abi_cxx11_(pcVar5);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      poVar7 = std::operator<<(poVar7,"\" ...) ");
      poVar7 = std::operator<<(poVar7,"includes target \"");
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(local_100->Target);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      std::operator<<(poVar7,"\" more than once in the export set.");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar10,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_2b8);
      this_local._7_1_ = 0;
      missingTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
      goto LAB_0084aee3;
    }
    std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::push_back
              ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
               ((long)&expectedTargets.field_2 + 8),&local_100);
    __gnu_cxx::
    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
    ::operator++(&local_80);
  } while( true );
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::vector<cmTargetExport*>::const_iterator tei =
           this->IEGen->GetExportSet()->GetTargetExports()->begin();
         tei != this->IEGen->GetExportSet()->GetTargetExports()->end();
         ++tei) {
      expectedTargets +=
        sep + this->Namespace + (*tei)->Target->GetExportName();
      sep = " ";
      cmTargetExport* te = *tei;
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te);
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str().c_str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (std::vector<cmTargetExport*>::const_iterator tei = allTargets.begin();
       tei != allTargets.end(); ++tei) {
    cmGeneratorTarget* gt = (*tei)->Target;

    requiresConfigFiles =
      requiresConfigFiles || gt->GetType() != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      *tei, cmGeneratorExpression::InstallInterface, properties,
      missingTargets);
    this->PopulateSourcesInterface(*tei,
                                   cmGeneratorExpression::InstallInterface,
                                   properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties,
            missingTargets) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::vector<std::string>::const_iterator ci =
           this->Configurations.begin();
         ci != this->Configurations.end(); ++ci) {
      if (!this->GenerateImportFileConfig(*ci, missingTargets)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}